

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

int uECC_valid_point(uECC_word_t *point,uECC_Curve curve)

{
  uECC_word_t *left;
  byte num_words;
  bool bVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uECC_word_t tmp1 [4];
  uECC_word_t tmp2 [4];
  uECC_word_t auStack_88 [3];
  ulong uStack_70;
  uECC_word_t local_68 [9];
  
  num_words = curve->num_words;
  uVar7 = (uint)num_words;
  if ((char)(num_words * '\x02') < '\x01') {
    return 0;
  }
  uVar5 = 0;
  uVar6 = 0;
  do {
    uVar6 = uVar6 | point[uVar5];
    uVar5 = uVar5 + 1;
  } while ((byte)(num_words * '\x02') != uVar5);
  uVar4 = uVar7;
  if (uVar6 == 0) {
    return 0;
  }
  while( true ) {
    uVar4 = uVar4 - 1;
    if ((char)uVar4 < '\0') {
      return 0;
    }
    uVar6 = (ulong)((uVar4 & 0x7f) << 3);
    uVar5 = *(ulong *)((long)curve->p + uVar6);
    uVar6 = *(ulong *)((long)point + uVar6);
    if (uVar6 < uVar5) break;
    if (uVar5 < uVar6) {
      return 0;
    }
  }
  left = point + (char)num_words;
  while( true ) {
    uVar7 = uVar7 - 1;
    if ((char)uVar7 < '\0') {
      return 0;
    }
    uVar6 = (ulong)((uVar7 & 0x7f) << 3);
    uVar5 = *(ulong *)((long)curve->p + uVar6);
    uVar6 = *(ulong *)((long)left + uVar6);
    if (uVar6 < uVar5) break;
    if (uVar5 < uVar6) {
      return 0;
    }
  }
  uECC_vli_mult(local_68,left,left,num_words);
  (*curve->mmod_fast)(auStack_88,local_68);
  (*curve->x_side)(local_68,point,curve);
  if (-1 < (char)(num_words - 1)) {
    uVar5 = 0;
    lVar2 = (ulong)(byte)(num_words - 1) + 1;
    do {
      uVar5 = uVar5 | (&uStack_70)[lVar2] ^ auStack_88[lVar2 + -1];
      lVar3 = lVar2 + -1;
      bVar1 = 0 < lVar2;
      lVar2 = lVar3;
    } while (lVar3 != 0 && bVar1);
    return (uint)(uVar5 == 0);
  }
  return 1;
}

Assistant:

int uECC_valid_point(const uECC_word_t *point, uECC_Curve curve) {
    uECC_word_t tmp1[uECC_MAX_WORDS];
    uECC_word_t tmp2[uECC_MAX_WORDS];
    wordcount_t num_words = curve->num_words;

    /* The point at infinity is invalid. */
    if (EccPoint_isZero(point, curve)) {
        return 0;
    }

    /* x and y must be smaller than p. */
    if (uECC_vli_cmp_unsafe(curve->p, point, num_words) != 1 ||
            uECC_vli_cmp_unsafe(curve->p, point + num_words, num_words) != 1) {
        return 0;
    }

    uECC_vli_modSquare_fast(tmp1, point + num_words, curve);
    curve->x_side(tmp2, point, curve); /* tmp2 = x^3 + ax + b */

    /* Make sure that y^2 == x^3 + ax + b */
    return (int)(uECC_vli_equal(tmp1, tmp2, num_words));
}